

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O0

void raviV_op_vararg(lua_State *L,CallInfo *ci,LClosure *cl,int a,int b)

{
  StkId pTVar1;
  TValue *io2;
  TValue *io1;
  int n;
  int j;
  StkId ra;
  StkId base;
  int b_local;
  int a_local;
  LClosure *cl_local;
  CallInfo *ci_local;
  lua_State *L_local;
  
  ra = (ci->u).l.base;
  io1._0_4_ = ((int)((long)ra - (long)ci->func >> 4) - (uint)cl->p->numparams) + -1;
  if ((int)io1 < 0) {
    io1._0_4_ = 0;
  }
  base._0_4_ = b + -1;
  if ((int)base < 0) {
    base._0_4_ = (int)io1;
    if ((long)L->stack_last - (long)L->top >> 4 <= (long)(int)io1) {
      luaD_growstack(L,(int)io1);
    }
    ra = (ci->u).l.base;
    _n = ra + a;
    L->top = _n + (int)io1;
  }
  else {
    _n = ra + a;
  }
  io1._4_4_ = 0;
  do {
    if ((int)base <= io1._4_4_ || (int)io1 <= io1._4_4_) {
      for (; io1._4_4_ < (int)base; io1._4_4_ = io1._4_4_ + 1) {
        _n[io1._4_4_].tt_ = 0;
      }
      return;
    }
    pTVar1 = _n + io1._4_4_;
    pTVar1->value_ = ra[(long)io1._4_4_ - (long)(int)io1].value_;
    pTVar1->tt_ = ra[(long)io1._4_4_ - (long)(int)io1].tt_;
    if ((pTVar1->tt_ & 0x8000) != 0) {
      if ((pTVar1->tt_ & 0x8000) == 0) {
        __assert_fail("(((io1)->tt_) & (1 << 15))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                      ,0xb96,"void raviV_op_vararg(lua_State *, CallInfo *, LClosure *, int, int)");
      }
      if ((pTVar1->tt_ & 0x7f) != (ushort)((pTVar1->value_).gc)->tt) {
LAB_00161bc0:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                      ,0xb96,"void raviV_op_vararg(lua_State *, CallInfo *, LClosure *, int, int)");
      }
      if (L != (lua_State *)0x0) {
        if ((pTVar1->tt_ & 0x8000) == 0) {
          __assert_fail("(((io1)->tt_) & (1 << 15))",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                        ,0xb96,"void raviV_op_vararg(lua_State *, CallInfo *, LClosure *, int, int)"
                       );
        }
        if ((((pTVar1->value_).gc)->marked & (L->l_G->currentwhite ^ 0x18)) != 0) goto LAB_00161bc0;
      }
    }
    io1._4_4_ = io1._4_4_ + 1;
  } while( true );
}

Assistant:

void raviV_op_vararg(lua_State *L, CallInfo *ci, LClosure *cl, int a, int b) {
  StkId base = ci->u.l.base;
  StkId ra;
  int j;
  int n = cast_int(base - ci->func) - cl->p->numparams - 1;
  if (n < 0) /* less arguments than parameters? */
    n = 0;   /* no vararg arguments */
  b = b - 1;
  if (b < 0) { /* B == 0? */
    b = n;     /* get all var. arguments */
    Protect_base(luaD_checkstack(L, n));
    ra = base + a; /* previous call may change the stack */
    L->top = ra + n;
  }
  else {
    ra = base + a;
  }
  for (j = 0; j < b && j < n; j++) 
    setobjs2s(L, ra + j, base - n + j);
  for (; j < b; j++) /* complete required results with nil */
    setnilvalue(ra + j);
}